

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int doprinuse(void)

{
  boolean bVar1;
  char cVar2;
  char local_58 [8];
  char lets [53];
  int local_14;
  obj *poStack_10;
  int ct;
  obj *otmp;
  
  local_14 = 0;
  poStack_10 = invent;
  do {
    if (poStack_10 == (obj *)0x0) {
      local_58[local_14] = '\0';
      if (local_14 == 0) {
        pline("You are not wearing or wielding anything.");
      }
      else {
        display_inventory(local_58,'\0');
      }
      return 0;
    }
    bVar1 = is_worn(poStack_10);
    if (bVar1 == '\0') {
      bVar1 = tool_in_use(poStack_10);
      if (bVar1 != '\0') goto LAB_001fa206;
    }
    else {
LAB_001fa206:
      cVar2 = obj_to_let(poStack_10);
      local_58[local_14] = cVar2;
      local_14 = local_14 + 1;
    }
    poStack_10 = poStack_10->nobj;
  } while( true );
}

Assistant:

int doprinuse(void)
{
	struct obj *otmp;
	int ct = 0;
	char lets[52+1];

	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_worn(otmp) || tool_in_use(otmp))
		lets[ct++] = obj_to_let(otmp);
	lets[ct] = '\0';
	if (!ct) pline("You are not wearing or wielding anything.");
	else display_inventory(lets, FALSE);
	return 0;
}